

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::
     genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>(Reader reader)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  Reader reader_06;
  Reader reader_07;
  Reader reader_08;
  Reader reader_09;
  Reader reader_10;
  Reader reader_11;
  Reader reader_12;
  Reader reader_13;
  Reader reader_14;
  Reader reader_15;
  Reader reader_16;
  Reader reader_17;
  Reader reader_18;
  Reader reader_19;
  Reader reader_20;
  Reader reader_21;
  Reader reader_22;
  Reader reader_23;
  Reader reader_24;
  Reader reader_25;
  Reader reader_26;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected;
  initializer_list<capnp::Data::Reader> expected_00;
  initializer_list<capnp::Text::Reader> expected_01;
  initializer_list<unsigned_long> expected_02;
  initializer_list<unsigned_int> expected_03;
  initializer_list<unsigned_short> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<long> expected_06;
  initializer_list<int> expected_07;
  initializer_list<short> expected_08;
  initializer_list<signed_char> expected_09;
  initializer_list<bool> expected_10;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::Text::Reader> expected_13;
  initializer_list<double> expected_14;
  initializer_list<float> expected_15;
  initializer_list<unsigned_long> expected_16;
  initializer_list<unsigned_int> expected_17;
  initializer_list<unsigned_short> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<long> expected_20;
  initializer_list<int> expected_21;
  initializer_list<short> expected_22;
  initializer_list<signed_char> expected_23;
  initializer_list<bool> expected_24;
  initializer_list<capnp::Void> expected_25;
  bool bVar1;
  float fVar2;
  double dVar3;
  TestEnum_9c8e9318b29d9cd3 local_1a0c [2];
  iterator local_1a08;
  undefined8 local_1a00;
  Reader local_19f8;
  Reader local_19c8;
  ArrayPtr<const_char> local_1998;
  bool local_1981;
  undefined1 local_1980 [7];
  bool _kj_shouldLog_46;
  ArrayPtr<const_char> local_1950;
  char (*local_1940) [13];
  undefined1 local_1938 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Reader> _kjCondition_50;
  ArrayPtr<const_char> local_18d8;
  bool local_18c1;
  undefined1 local_18c0 [7];
  bool _kj_shouldLog_45;
  ArrayPtr<const_char> local_1890;
  char (*local_1880) [13];
  undefined1 local_1878 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Reader> _kjCondition_49;
  ArrayPtr<const_char> local_1818;
  bool local_1801;
  undefined1 local_1800 [7];
  bool _kj_shouldLog_44;
  ArrayPtr<const_char> local_17d0;
  char (*local_17c0) [13];
  undefined1 local_17b8 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Reader> _kjCondition_48;
  Fault local_1780;
  Fault f_3;
  uint local_1770;
  DebugExpression<unsigned_int> local_176c;
  undefined1 local_1768 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_47;
  Reader listReader_3;
  Reader local_16d8;
  Reader local_16a8;
  Reader RStack_1698;
  Reader RStack_1688;
  iterator local_1678;
  undefined8 local_1670;
  Reader local_1668;
  bool local_1633;
  bool local_1632;
  DebugExpression<bool> local_1631;
  bool _kj_shouldLog_43;
  double dStack_1630;
  DebugExpression<bool> _kjCondition_46;
  float local_1628;
  bool local_1621;
  double dStack_1620;
  bool _kj_shouldLog_42;
  float local_1618;
  DebugExpression<float> local_1614;
  undefined1 local_1610 [8];
  DebugComparison<float,_double> _kjCondition_45;
  float local_15e0;
  bool local_15d9;
  double dStack_15d8;
  bool _kj_shouldLog_41;
  float local_15d0;
  DebugExpression<float> local_15cc;
  undefined1 local_15c8 [8];
  DebugComparison<float,_double> _kjCondition_44;
  double local_1598;
  bool local_1589;
  double dStack_1588;
  bool _kj_shouldLog_40;
  double local_1580;
  DebugExpression<double> local_1578;
  undefined1 local_1570 [8];
  DebugComparison<double,_double> _kjCondition_43;
  Fault local_1540;
  Fault f_2;
  uint local_1530;
  DebugExpression<unsigned_int> local_152c;
  undefined1 local_1528 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_42;
  Reader listReader_2;
  float local_14d0;
  bool _kj_shouldLog_39;
  float fStack_14cc;
  DebugExpression<bool> _kjCondition_41;
  bool local_14c5;
  float local_14c4;
  float fStack_14c0;
  bool _kj_shouldLog_38;
  DebugExpression<float> local_14bc;
  undefined1 local_14b8 [8];
  DebugComparison<float,_float> _kjCondition_40;
  bool local_148d;
  float local_148c;
  float fStack_1488;
  bool _kj_shouldLog_37;
  DebugExpression<float> local_1484;
  undefined1 local_1480 [8];
  DebugComparison<float,_float> _kjCondition_39;
  bool local_1455;
  float local_1454;
  float fStack_1450;
  bool _kj_shouldLog_36;
  DebugExpression<float> local_144c;
  undefined1 local_1448 [8];
  DebugComparison<float,_float> _kjCondition_38;
  Fault local_1420;
  Fault f_1;
  uint local_1410;
  DebugExpression<unsigned_int> local_140c;
  undefined1 local_1408 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_37;
  Reader listReader_1;
  Reader local_13a0;
  uint local_136c;
  iterator local_1368;
  undefined8 local_1360;
  Reader local_1358;
  unsigned_short local_1324 [2];
  iterator local_1320;
  undefined8 local_1318;
  Reader local_1310;
  uchar local_12da [2];
  iterator local_12d8;
  undefined8 local_12d0;
  Reader local_12c8;
  long local_1298 [2];
  iterator local_1288;
  undefined8 local_1280;
  Reader local_1278;
  int local_1248 [2];
  iterator local_1240;
  undefined8 local_1238;
  Reader local_1230;
  short local_11fc [2];
  iterator local_11f8;
  undefined8 local_11f0;
  Reader local_11e8;
  char local_11b2 [2];
  iterator local_11b0;
  undefined8 local_11a8;
  Reader local_11a0;
  bool local_116c [4];
  iterator local_1168;
  undefined8 local_1160;
  Reader local_1158;
  Reader local_1128;
  uint local_10f4;
  uint local_10f0;
  bool local_10e9;
  undefined1 local_10e8 [7];
  bool _kj_shouldLog_35;
  uint local_10b4;
  uint local_10b0;
  DebugExpression<unsigned_int> local_10ac;
  undefined1 local_10a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_36;
  bool local_107f;
  TestEnum local_107e;
  TestEnum_9c8e9318b29d9cd3 local_107c;
  DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_107a;
  undefined1 local_1078;
  bool _kj_shouldLog_34;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition_35;
  Reader local_1040;
  Reader local_1010;
  ArrayPtr<const_char> local_fe0;
  bool local_fc9;
  undefined1 local_fc8 [7];
  bool _kj_shouldLog_33;
  ArrayPtr<const_char> local_f98;
  char (*local_f88) [15];
  undefined1 local_f80 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Reader> _kjCondition_34;
  ArrayPtr<const_char> local_f20;
  bool local_f09;
  undefined1 local_f08 [7];
  bool _kj_shouldLog_32;
  ArrayPtr<const_char> local_ed8;
  char (*local_ec8) [15];
  undefined1 local_ec0 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Reader> _kjCondition_33;
  ArrayPtr<const_char> local_e60;
  bool local_e49;
  undefined1 local_e48 [7];
  bool _kj_shouldLog_31;
  ArrayPtr<const_char> local_e18;
  char (*local_e08) [15];
  undefined1 local_e00 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Reader> _kjCondition_32;
  uint local_dc0;
  uint local_dbc;
  Fault local_db8;
  Fault f;
  uint local_da8;
  DebugExpression<unsigned_int> local_da4;
  undefined1 local_da0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  Reader listReader;
  Reader local_d10;
  Reader local_ce0;
  Reader RStack_cd0;
  Reader RStack_cc0;
  iterator local_cb0;
  undefined8 local_ca8;
  Reader local_ca0;
  double local_c70 [6];
  iterator local_c40;
  undefined8 local_c38;
  Reader local_c30;
  float local_c00 [6];
  iterator local_be8;
  undefined8 local_be0;
  Reader local_bd8;
  unsigned_long local_ba8 [4];
  iterator local_b88;
  undefined8 local_b80;
  Reader local_b78;
  uint local_b48 [4];
  iterator local_b38;
  undefined8 local_b30;
  Reader local_b28;
  unsigned_short local_af8 [4];
  iterator local_af0;
  undefined8 local_ae8;
  Reader local_ae0;
  uchar local_aac [4];
  iterator local_aa8;
  undefined8 local_aa0;
  Reader local_a98;
  long local_a68 [4];
  iterator local_a48;
  undefined8 local_a40;
  Reader local_a38;
  int local_a08 [4];
  iterator local_9f8;
  undefined8 local_9f0;
  Reader local_9e8;
  short local_9b8 [4];
  iterator local_9b0;
  undefined8 local_9a8;
  Reader local_9a0;
  char local_96c [4];
  iterator local_968;
  undefined8 local_960;
  Reader local_958;
  bool local_925 [5];
  iterator local_920;
  undefined8 local_918;
  Reader local_910;
  Void local_8db [3];
  iterator local_8d8;
  undefined8 local_8d0;
  Reader local_8c8;
  TestEnum local_894;
  TestEnum_9c8e9318b29d9cd3 local_892;
  bool local_88f;
  TestEnum local_88e;
  TestEnum_9c8e9318b29d9cd3 local_88c;
  DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_88a;
  undefined1 local_888;
  bool _kj_shouldLog_30;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition_30;
  ArrayPtr<const_char> local_838;
  bool local_821;
  undefined1 local_820 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_7f0;
  char (*local_7e0) [14];
  undefined1 local_7d8 [8];
  DebugComparison<const_char_(&)[14],_capnp::Text::Reader> _kjCondition_29;
  bool local_791;
  undefined1 auStack_790 [7];
  bool _kj_shouldLog_28;
  char (*local_780) [7];
  undefined1 local_778 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Reader> _kjCondition_28;
  Reader subSubReader;
  ArrayPtr<const_unsigned_char> local_708;
  bool local_6f1;
  undefined1 auStack_6f0 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_6e0;
  ArrayPtr<const_unsigned_char> local_6d0;
  undefined1 local_6c0 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition_27;
  bool local_671;
  undefined1 auStack_670 [7];
  bool _kj_shouldLog_26;
  char (*local_660) [4];
  undefined1 local_658 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_26;
  double local_620;
  bool local_617;
  bool local_616;
  DebugExpression<bool> local_615;
  float local_614;
  bool _kj_shouldLog_25;
  float fStack_610;
  DebugExpression<bool> _kjCondition_25;
  bool local_60b;
  bool local_60a;
  DebugExpression<bool> local_609;
  bool _kj_shouldLog_24;
  uint64_t uStack_608;
  DebugExpression<bool> _kjCondition_24;
  unsigned_long_long local_600;
  bool local_5f1;
  uint64_t uStack_5f0;
  bool _kj_shouldLog_23;
  unsigned_long_long local_5e8;
  DebugExpression<unsigned_long_long> local_5e0;
  undefined1 local_5d8 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_23;
  bool local_5a5;
  uint32_t local_5a4;
  uint uStack_5a0;
  bool _kj_shouldLog_22;
  DebugExpression<unsigned_int> local_59c;
  undefined1 local_598 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_22;
  uint local_570;
  bool local_56b;
  uint16_t local_56a;
  uint local_568;
  bool _kj_shouldLog_21;
  DebugExpression<unsigned_int> DStack_564;
  undefined1 local_560 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_21;
  uint local_538;
  bool local_532;
  uint8_t local_531;
  uint local_530;
  bool _kj_shouldLog_20;
  DebugExpression<unsigned_int> DStack_52c;
  undefined1 local_528 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_20;
  longlong local_500;
  bool local_4f1;
  int64_t iStack_4f0;
  bool _kj_shouldLog_19;
  longlong local_4e8;
  DebugExpression<long_long> local_4e0;
  undefined1 local_4d8 [8];
  DebugComparison<long_long,_long> _kjCondition_19;
  bool local_4a5;
  int32_t local_4a4;
  int iStack_4a0;
  bool _kj_shouldLog_18;
  DebugExpression<int> local_49c;
  undefined1 local_498 [8];
  DebugComparison<int,_int> _kjCondition_18;
  int local_470;
  bool local_46b;
  int16_t local_46a;
  int local_468;
  bool _kj_shouldLog_17;
  DebugExpression<int> DStack_464;
  undefined1 local_460 [8];
  DebugComparison<int,_short> _kjCondition_17;
  int local_438;
  bool local_432;
  int8_t local_431;
  int local_430;
  bool _kj_shouldLog_16;
  DebugExpression<int> DStack_42c;
  undefined1 local_428 [8];
  DebugComparison<int,_signed_char> _kjCondition_16;
  undefined1 local_400 [4];
  bool _kj_shouldLog_15;
  DebugComparison<bool,_bool> _kjCondition_15;
  bool _kj_shouldLog_14;
  DebugExpression<const_capnp::Void_&> DStack_3d8;
  undefined1 local_3d0 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_14;
  Reader subReader;
  ArrayPtr<const_unsigned_char> local_368;
  bool local_351;
  undefined1 auStack_350 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_340;
  ArrayPtr<const_unsigned_char> local_330;
  undefined1 local_320 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> _kjCondition_13;
  bool local_2d1;
  undefined1 auStack_2d0 [7];
  bool _kj_shouldLog_12;
  char (*local_2c0) [4];
  undefined1 local_2b8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_12;
  double local_280;
  bool local_277;
  bool local_276;
  DebugExpression<bool> local_275;
  float local_274;
  bool _kj_shouldLog_11;
  float fStack_270;
  DebugExpression<bool> _kjCondition_11;
  bool local_26b;
  bool local_26a;
  DebugExpression<bool> local_269;
  bool _kj_shouldLog_10;
  uint64_t uStack_268;
  DebugExpression<bool> _kjCondition_10;
  unsigned_long_long local_260;
  bool local_251;
  uint64_t uStack_250;
  bool _kj_shouldLog_9;
  unsigned_long_long local_248;
  DebugExpression<unsigned_long_long> local_240;
  undefined1 local_238 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_9;
  bool local_205;
  uint32_t local_204;
  uint uStack_200;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int> local_1fc;
  undefined1 local_1f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  uint local_1d0;
  bool local_1cb;
  uint16_t local_1ca;
  uint local_1c8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int> DStack_1c4;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_7;
  uint local_198;
  bool local_192;
  uint8_t local_191;
  uint local_190;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int> DStack_18c;
  undefined1 local_188 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_6;
  longlong local_160;
  bool local_151;
  int64_t iStack_150;
  bool _kj_shouldLog_5;
  longlong local_148;
  DebugExpression<long_long> local_140;
  undefined1 local_138 [8];
  DebugComparison<long_long,_long> _kjCondition_5;
  bool local_105;
  int32_t local_104;
  int iStack_100;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_fc;
  undefined1 local_f8 [8];
  DebugComparison<int,_int> _kjCondition_4;
  int local_d0;
  bool local_cb;
  int16_t local_ca;
  int local_c8;
  bool _kj_shouldLog_3;
  DebugExpression<int> DStack_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_short> _kjCondition_3;
  int local_98;
  bool local_92;
  int8_t local_91;
  int local_90;
  bool _kj_shouldLog_2;
  DebugExpression<int> DStack_8c;
  undefined1 local_88 [8];
  DebugComparison<int,_signed_char> _kjCondition_2;
  undefined1 local_60 [4];
  bool _kj_shouldLog_1;
  DebugComparison<bool,_bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<const_capnp::Void_&> DStack_38;
  undefined1 local_30 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  
  DStack_38 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,
             (DebugExpression<capnp::Void_const&> *)&stack0xffffffffffffffc8,
             (Void *)&_kjCondition_1.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    _kjCondition_1._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", _kjCondition, VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,(Void *)&VOID,
                 (Void *)&_kjCondition_1.field_0x1c);
      _kjCondition_1._29_1_ = 0;
    }
  }
  _kjCondition_2._30_1_ = 1;
  _kjCondition_2._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1e);
  _kjCondition_2._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField((Reader *)&stack0x00000008);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_60,
             (DebugExpression<bool> *)&_kjCondition_2.field_0x1f,(bool *)&_kjCondition_2.field_0x1d)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    _kjCondition_2._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._28_1_ != '\0') {
      _kjCondition_2._27_1_ = 1;
      _kjCondition_2._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(true) == (reader.getBoolField())\", _kjCondition, true, reader.getBoolField()"
                 ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_60,(bool *)&_kjCondition_2.field_0x1b,
                 (bool *)&_kjCondition_2.field_0x1a);
      _kjCondition_2._28_1_ = 0;
    }
  }
  local_90 = -0x7b;
  DStack_8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  local_91 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                       ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_88,&stack0xffffffffffffff74,&local_91);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_92 = kj::_::Debug::shouldLog(ERROR);
    while (local_92 != false) {
      local_98 = -0x7b;
      _kjCondition_3._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdd,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", _kjCondition, -123, reader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_88,&local_98,&_kjCondition_3.field_0x1f)
      ;
      local_92 = false;
    }
  }
  local_c8 = -0x3039;
  DStack_c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  local_ca = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                       ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_c0,&stack0xffffffffffffff3c,&local_ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    local_cb = kj::_::Debug::shouldLog(ERROR);
    while (local_cb != false) {
      local_d0 = -0x3039;
      _kjCondition_4._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", _kjCondition, -12345, reader.getInt16Field()"
                 ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_c0,&local_d0,
                 (short *)&_kjCondition_4.field_0x1e);
      local_cb = false;
    }
  }
  iStack_100 = -0xbc614e;
  local_fc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff00);
  local_104 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_f8,&local_fc,&local_104);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    local_105 = kj::_::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      _kjCondition_5._36_4_ = 0xff439eb2;
      _kjCondition_5._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", _kjCondition, -12345678, reader.getInt32Field()"
                 ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_f8,(int *)&_kjCondition_5.field_0x24,
                 (int *)&_kjCondition_5.result);
      local_105 = false;
    }
  }
  local_148 = -0x7048860ddf79;
  local_140 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_148);
  iStack_150 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                         ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_138,&local_140,&stack0xfffffffffffffeb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_151 = kj::_::Debug::shouldLog(ERROR);
    while (local_151 != false) {
      local_160 = -0x7048860ddf79;
      _kjCondition_6._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", _kjCondition, -123456789012345ll, reader.getInt64Field()"
                 ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())"
                 ,(DebugComparison<long_long,_long> *)local_138,&local_160,
                 (long *)&_kjCondition_6.result);
      local_151 = false;
    }
  }
  local_190 = 0xea;
  DStack_18c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
  local_191 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_188,&stack0xfffffffffffffe74,
             &local_191);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_192 = kj::_::Debug::shouldLog(ERROR);
    while (local_192 != false) {
      local_198 = 0xea;
      _kjCondition_7._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", _kjCondition, 234u, reader.getUInt8Field()"
                 ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_188,&local_198,
                 &_kjCondition_7.field_0x1f);
      local_192 = false;
    }
  }
  local_1c8 = 0xb26e;
  DStack_1c4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c8);
  local_1ca = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1c0,&stack0xfffffffffffffe3c,
             &local_1ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
  if (!bVar1) {
    local_1cb = kj::_::Debug::shouldLog(ERROR);
    while (local_1cb != false) {
      local_1d0 = 0xb26e;
      _kjCondition_8._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe2,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", _kjCondition, 45678u, reader.getUInt16Field()"
                 ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_1c0,&local_1d0,
                 (unsigned_short *)&_kjCondition_8.field_0x1e);
      local_1cb = false;
    }
  }
  uStack_200 = 0xce0a6a14;
  local_1fc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe00);
  local_204 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                        ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1f8,&local_1fc,&local_204);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
  if (!bVar1) {
    local_205 = kj::_::Debug::shouldLog(ERROR);
    while (local_205 != false) {
      _kjCondition_9._36_4_ = 0xce0a6a14;
      _kjCondition_9._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe3,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", _kjCondition, 3456789012u, reader.getUInt32Field()"
                 ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1f8,
                 (uint *)&_kjCondition_9.field_0x24,(uint *)&_kjCondition_9.result);
      local_205 = false;
    }
  }
  local_248 = 0xab54a98ceb1f0ad2;
  local_240 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_248);
  uStack_250 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                         ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_238,&local_240,
             &stack0xfffffffffffffdb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    local_251 = kj::_::Debug::shouldLog(ERROR);
    while (local_251 != false) {
      local_260 = 0xab54a98ceb1f0ad2;
      uStack_268 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                             ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe4,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", _kjCondition, 12345678901234567890ull, reader.getUInt64Field()"
                 ,(char (*) [72])
                  "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_238,&local_260,
                 &stack0xfffffffffffffd98);
      local_251 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                    ((Reader *)&stack0x00000008);
  local_26a = kj::_::floatAlmostEqual(fVar2,1234.5);
  local_269 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_26a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_269);
  if (!bVar1) {
    local_26b = kj::_::Debug::shouldLog(ERROR);
    while (local_26b != false) {
      fStack_270 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                             ((Reader *)&stack0x00000008);
      local_274 = 1234.5;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", _kjCondition, reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 &local_269,&stack0xfffffffffffffd90,&local_274);
      local_26b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                    ((Reader *)&stack0x00000008);
  local_276 = kj::_::doubleAlmostEqual(dVar3,-1.23e+47);
  local_275 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_276);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_275);
  if (!bVar1) {
    local_277 = kj::_::Debug::shouldLog(ERROR);
    while (local_277 != false) {
      local_280 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                            ((Reader *)&stack0x00000008);
      _kjCondition_12.result = false;
      _kjCondition_12._41_7_ = 0xc9b58b82c0e0bb;
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", _kjCondition, reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 &local_275,&local_280,(double *)&_kjCondition_12.result);
      local_277 = false;
    }
  }
  local_2c0 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  _auStack_2d0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_2b8,
             (DebugExpression<char_const(&)[4]> *)&local_2c0,(Reader *)auStack_2d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
  if (!bVar1) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", _kjCondition, \"foo\", reader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_2b8,
                 (char (*) [4])"foo",(Reader *)&_kjCondition_13.result);
      local_2d1 = false;
    }
  }
  local_340 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  local_330 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_340);
  _auStack_350 = (ArrayPtr<const_unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                           ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_320,
             (DebugExpression<capnp::Data::Reader> *)&local_330,(Reader *)auStack_350);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_320);
  if (!bVar1) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      local_368 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", _kjCondition, data(\"bar\"), reader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_320,
                 (Reader *)&local_368,(Reader *)&subReader._reader.nestingLimit);
      local_351 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)&_kjCondition_14.result,(Reader *)&stack0x00000008);
  DStack_3d8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&_kjCondition_14.result)
  ;
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3d0,
             (DebugExpression<capnp::Void_const&> *)&stack0xfffffffffffffc28,
             (Void *)&_kjCondition_15.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d0);
  if (!bVar1) {
    _kjCondition_15._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField
                ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", _kjCondition, VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3d0,(Void *)&VOID,
                 (Void *)&_kjCondition_15.field_0x1c);
      _kjCondition_15._29_1_ = 0;
    }
  }
  _kjCondition_16._30_1_ = 1;
  _kjCondition_16._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_16.field_0x1e);
  _kjCondition_16._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                 ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_400,
             (DebugExpression<bool> *)&_kjCondition_16.field_0x1f,
             (bool *)&_kjCondition_16.field_0x1d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_400);
  if (!bVar1) {
    _kjCondition_16._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_16._28_1_ != '\0') {
      _kjCondition_16._27_1_ = 1;
      _kjCondition_16._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.getBoolField())\", _kjCondition, true, subReader.getBoolField()"
                 ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_400,(bool *)&_kjCondition_16.field_0x1b,
                 (bool *)&_kjCondition_16.field_0x1a);
      _kjCondition_16._28_1_ = 0;
    }
  }
  local_430 = -0xc;
  DStack_42c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_430);
  local_431 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_428,&stack0xfffffffffffffbd4,&local_431);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_428);
  if (!bVar1) {
    local_432 = kj::_::Debug::shouldLog(ERROR);
    while (local_432 != false) {
      local_438 = -0xc;
      _kjCondition_17._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", _kjCondition, -12, subReader.getInt8Field()"
                 ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_428,&local_438,
                 &_kjCondition_17.field_0x1f);
      local_432 = false;
    }
  }
  local_468 = 0xd80;
  DStack_464 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_468);
  local_46a = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_460,&stack0xfffffffffffffb9c,&local_46a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_460);
  if (!bVar1) {
    local_46b = kj::_::Debug::shouldLog(ERROR);
    while (local_46b != false) {
      local_470 = 0xd80;
      _kjCondition_18._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", _kjCondition, 3456, subReader.getInt16Field()"
                 ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_460,&local_470,
                 (short *)&_kjCondition_18.field_0x1e);
      local_46b = false;
    }
  }
  iStack_4a0 = -0x4b3eff2;
  local_49c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffb60);
  local_4a4 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_498,&local_49c,&local_4a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_498);
  if (!bVar1) {
    local_4a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_4a5 != false) {
      _kjCondition_19._36_4_ = 0xfb4c100e;
      _kjCondition_19._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", _kjCondition, -78901234, subReader.getInt32Field()"
                 ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_498,(int *)&_kjCondition_19.field_0x24,
                 (int *)&_kjCondition_19.result);
      local_4a5 = false;
    }
  }
  local_4e8 = 0x33a638e8734e;
  local_4e0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4e8);
  iStack_4f0 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                         ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_4d8,&local_4e0,&stack0xfffffffffffffb10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4d8);
  if (!bVar1) {
    local_4f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f1 != false) {
      local_500 = 0x33a638e8734e;
      _kjCondition_20._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", _kjCondition, 56789012345678ll, subReader.getInt64Field()"
                 ,(char (*) [67])
                  "failed: expected (56789012345678ll) == (subReader.getInt64Field())",
                 (DebugComparison<long_long,_long> *)local_4d8,&local_500,
                 (long *)&_kjCondition_20.result);
      local_4f1 = false;
    }
  }
  local_530 = 0x5a;
  DStack_52c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_530);
  local_531 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_528,&stack0xfffffffffffffad4,
             &local_531);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_528);
  if (!bVar1) {
    local_532 = kj::_::Debug::shouldLog(ERROR);
    while (local_532 != false) {
      local_538 = 0x5a;
      _kjCondition_21._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", _kjCondition, 90u, subReader.getUInt8Field()"
                 ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_528,&local_538,
                 &_kjCondition_21.field_0x1f);
      local_532 = false;
    }
  }
  local_568 = 0x4d2;
  DStack_564 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_568);
  local_56a = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_560,&stack0xfffffffffffffa9c,
             &local_56a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_560);
  if (!bVar1) {
    local_56b = kj::_::Debug::shouldLog(ERROR);
    while (local_56b != false) {
      local_570 = 0x4d2;
      _kjCondition_22._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", _kjCondition, 1234u, subReader.getUInt16Field()"
                 ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_560,&local_570,
                 (unsigned_short *)&_kjCondition_22.field_0x1e);
      local_56b = false;
    }
  }
  uStack_5a0 = 0x3628814;
  local_59c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa60);
  local_5a4 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_598,&local_59c,&local_5a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_598);
  if (!bVar1) {
    local_5a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_5a5 != false) {
      _kjCondition_23._36_4_ = 0x3628814;
      _kjCondition_23._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", _kjCondition, 56789012u, subReader.getUInt32Field()"
                 ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_598,
                 (uint *)&_kjCondition_23.field_0x24,(uint *)&_kjCondition_23.result);
      local_5a5 = false;
    }
  }
  local_5e8 = 0x4cc1921126f0ad2;
  local_5e0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5e8);
  uStack_5f0 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                         ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_5d8,&local_5e0,
             &stack0xfffffffffffffa10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5d8);
  if (!bVar1) {
    local_5f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5f1 != false) {
      local_600 = 0x4cc1921126f0ad2;
      uStack_608 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                             ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", _kjCondition, 345678901234567890ull, subReader.getUInt64Field()"
                 ,(char (*) [73])
                  "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_5d8,&local_600,
                 &stack0xfffffffffffff9f8);
      local_5f1 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                    ((Reader *)&_kjCondition_14.result);
  local_60a = kj::_::floatAlmostEqual(fVar2,-1.25e-10);
  local_609 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_609);
  if (!bVar1) {
    local_60b = kj::_::Debug::shouldLog(ERROR);
    while (local_60b != false) {
      fStack_610 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                             ((Reader *)&_kjCondition_14.result);
      local_614 = -1.25e-10;
      kj::_::Debug::log<char_const(&)[84],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", _kjCondition, subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,&local_609,&stack0xfffffffffffff9f0,&local_614);
      local_60b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                    ((Reader *)&_kjCondition_14.result);
  local_616 = kj::_::doubleAlmostEqual(dVar3,345.0);
  local_615 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_616);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_615);
  if (!bVar1) {
    local_617 = kj::_::Debug::shouldLog(ERROR);
    while (local_617 != false) {
      local_620 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                            ((Reader *)&_kjCondition_14.result);
      _kjCondition_26._44_4_ = 0x159;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", _kjCondition, subReader.getFloat64Field(), 345"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
                 &local_615,&local_620,(int *)&_kjCondition_26.field_0x2c);
      local_617 = false;
    }
  }
  local_660 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0xa0bef3);
  _auStack_670 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_658,
             (DebugExpression<char_const(&)[4]> *)&local_660,(Reader *)auStack_670);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_658);
  if (!bVar1) {
    local_671 = kj::_::Debug::shouldLog(ERROR);
    while (local_671 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf7,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", _kjCondition, \"baz\", subReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_658,
                 (char (*) [4])0xa0bef3,(Reader *)&_kjCondition_27.result);
      local_671 = false;
    }
  }
  local_6e0 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  local_6d0 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_6e0);
  _auStack_6f0 = (ArrayPtr<const_unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                           ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_6c0,
             (DebugExpression<capnp::Data::Reader> *)&local_6d0,(Reader *)auStack_6f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6c0);
  if (!bVar1) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      local_708 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                     ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", _kjCondition, data(\"qux\"), subReader.getDataField()"
                 ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_6c0,
                 (Reader *)&local_708,(Reader *)&subSubReader._reader.nestingLimit);
      local_6f1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)&_kjCondition_28.result,(Reader *)&_kjCondition_14.result);
  local_780 = (char (*) [7])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])0x9f8950);
  _auStack_790 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&_kjCondition_28.result);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_778,
             (DebugExpression<char_const(&)[7]> *)&local_780,(Reader *)auStack_790);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_778);
  if (!bVar1) {
    local_791 = kj::_::Debug::shouldLog(ERROR);
    while (local_791 != false) {
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                     ((Reader *)&_kjCondition_28.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfb,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", _kjCondition, \"nested\", subSubReader.getTextField()"
                 ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
                 (DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_778,
                 (char (*) [7])0x9f8950,(Reader *)&_kjCondition_29.result);
      local_791 = false;
    }
  }
  local_7e0 = (char (*) [14])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [14])"really nested"
                        );
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)local_820,(Reader *)&_kjCondition_28.result);
  local_7f0 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_820);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_7d8,
             (DebugExpression<char_const(&)[14]> *)&local_7e0,(Reader *)&local_7f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7d8);
  if (!bVar1) {
    local_821 = kj::_::Debug::shouldLog(ERROR);
    while (local_821 != false) {
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
                ((Reader *)&_kjCondition_30.result,(Reader *)&_kjCondition_28.result);
      local_838 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&_kjCondition_30.result);
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfc,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"really nested\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [85])
                  "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
                 ,(DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_7d8,
                 (char (*) [14])"really nested",(Reader *)&local_838);
      local_821 = false;
    }
  }
  local_88c = BAZ;
  local_88a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_88c);
  local_88e = capnproto_test::capnp::test::TestAllTypes::Reader::getEnumField
                        ((Reader *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3>::operator==
            ((DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              *)&local_888,&local_88a,&local_88e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_888);
  if (!bVar1) {
    local_88f = kj::_::Debug::shouldLog(ERROR);
    while (local_88f != false) {
      local_892 = BAZ;
      local_894 = capnproto_test::capnp::test::TestAllTypes::Reader::getEnumField
                            ((Reader *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfe,ERROR,
                 "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", _kjCondition, TestEnum::BAZ, subReader.getEnumField()"
                 ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&local_888,&local_892,&local_894);
      local_88f = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            (&local_8c8,(Reader *)&_kjCondition_14.result);
  local_8d8 = local_8db;
  local_8d0 = 3;
  expected_25._M_len = 3;
  expected_25._M_array = local_8d8;
  reader_00.reader.capTable = local_8c8.reader.capTable;
  reader_00.reader.segment = local_8c8.reader.segment;
  reader_00.reader.ptr = local_8c8.reader.ptr;
  reader_00.reader.elementCount = local_8c8.reader.elementCount;
  reader_00.reader.step = local_8c8.reader.step;
  reader_00.reader.structDataSize = local_8c8.reader.structDataSize;
  reader_00.reader.structPointerCount = local_8c8.reader.structPointerCount;
  reader_00.reader.elementSize = local_8c8.reader.elementSize;
  reader_00.reader._39_1_ = local_8c8.reader._39_1_;
  reader_00.reader.nestingLimit = local_8c8.reader.nestingLimit;
  reader_00.reader._44_4_ = local_8c8.reader._44_4_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Reader,_capnp::List<capnp::Void,_(capnp::Kind)0>_>
            (reader_00,expected_25);
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            (&local_910,(Reader *)&_kjCondition_14.result);
  local_925[0] = false;
  local_925[1] = true;
  local_925[2] = false;
  local_925[3] = true;
  local_925[4] = true;
  local_920 = local_925;
  local_918 = 5;
  expected_24._M_len = 5;
  expected_24._M_array = local_920;
  reader_01.reader.capTable = local_910.reader.capTable;
  reader_01.reader.segment = local_910.reader.segment;
  reader_01.reader.ptr = local_910.reader.ptr;
  reader_01.reader.elementCount = local_910.reader.elementCount;
  reader_01.reader.step = local_910.reader.step;
  reader_01.reader.structDataSize = local_910.reader.structDataSize;
  reader_01.reader.structPointerCount = local_910.reader.structPointerCount;
  reader_01.reader.elementSize = local_910.reader.elementSize;
  reader_01.reader._39_1_ = local_910.reader._39_1_;
  reader_01.reader.nestingLimit = local_910.reader.nestingLimit;
  reader_01.reader._44_4_ = local_910.reader._44_4_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_01,expected_24);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            (&local_958,(Reader *)&_kjCondition_14.result);
  builtin_strncpy(local_96c,"\fހ\x7f",4);
  local_968 = local_96c;
  local_960 = 4;
  expected_23._M_len = 4;
  expected_23._M_array = local_968;
  reader_02.reader.capTable = local_958.reader.capTable;
  reader_02.reader.segment = local_958.reader.segment;
  reader_02.reader.ptr = local_958.reader.ptr;
  reader_02.reader.elementCount = local_958.reader.elementCount;
  reader_02.reader.step = local_958.reader.step;
  reader_02.reader.structDataSize = local_958.reader.structDataSize;
  reader_02.reader.structPointerCount = local_958.reader.structPointerCount;
  reader_02.reader.elementSize = local_958.reader.elementSize;
  reader_02.reader._39_1_ = local_958.reader._39_1_;
  reader_02.reader.nestingLimit = local_958.reader.nestingLimit;
  reader_02.reader._44_4_ = local_958.reader._44_4_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_02,expected_23);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            (&local_9a0,(Reader *)&_kjCondition_14.result);
  local_9b8[0] = 0x4d2;
  local_9b8[1] = 0xe9d2;
  local_9b8[2] = 0x8000;
  local_9b8[3] = 0x7fff;
  local_9b0 = local_9b8;
  local_9a8 = 4;
  expected_22._M_len = 4;
  expected_22._M_array = local_9b0;
  reader_03.reader.capTable = local_9a0.reader.capTable;
  reader_03.reader.segment = local_9a0.reader.segment;
  reader_03.reader.ptr = local_9a0.reader.ptr;
  reader_03.reader.elementCount = local_9a0.reader.elementCount;
  reader_03.reader.step = local_9a0.reader.step;
  reader_03.reader.structDataSize = local_9a0.reader.structDataSize;
  reader_03.reader.structPointerCount = local_9a0.reader.structPointerCount;
  reader_03.reader.elementSize = local_9a0.reader.elementSize;
  reader_03.reader._39_1_ = local_9a0.reader._39_1_;
  reader_03.reader.nestingLimit = local_9a0.reader.nestingLimit;
  reader_03.reader._44_4_ = local_9a0.reader._44_4_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_03,expected_22);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            (&local_9e8,(Reader *)&_kjCondition_14.result);
  local_a08[0] = 0xbc614e;
  local_a08[1] = 0xfaa0d340;
  local_a08[2] = 0x80000000;
  local_a08[3] = 0x7fffffff;
  local_9f8 = local_a08;
  local_9f0 = 4;
  expected_21._M_len = 4;
  expected_21._M_array = local_9f8;
  reader_04.reader.capTable = local_9e8.reader.capTable;
  reader_04.reader.segment = local_9e8.reader.segment;
  reader_04.reader.ptr = local_9e8.reader.ptr;
  reader_04.reader.elementCount = local_9e8.reader.elementCount;
  reader_04.reader.step = local_9e8.reader.step;
  reader_04.reader.structDataSize = local_9e8.reader.structDataSize;
  reader_04.reader.structPointerCount = local_9e8.reader.structPointerCount;
  reader_04.reader.elementSize = local_9e8.reader.elementSize;
  reader_04.reader._39_1_ = local_9e8.reader._39_1_;
  reader_04.reader.nestingLimit = local_9e8.reader.nestingLimit;
  reader_04.reader._44_4_ = local_9e8.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_04,expected_21);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            (&local_a38,(Reader *)&_kjCondition_14.result);
  local_a68[0] = 0x7048860ddf79;
  local_a68[1] = 0xfffd968afd13752e;
  local_a68[2] = 0x8000000000000000;
  local_a68[3] = 0x7fffffffffffffff;
  local_a48 = local_a68;
  local_a40 = 4;
  expected_20._M_len = 4;
  expected_20._M_array = local_a48;
  reader_05.reader.capTable = local_a38.reader.capTable;
  reader_05.reader.segment = local_a38.reader.segment;
  reader_05.reader.ptr = local_a38.reader.ptr;
  reader_05.reader.elementCount = local_a38.reader.elementCount;
  reader_05.reader.step = local_a38.reader.step;
  reader_05.reader.structDataSize = local_a38.reader.structDataSize;
  reader_05.reader.structPointerCount = local_a38.reader.structPointerCount;
  reader_05.reader.elementSize = local_a38.reader.elementSize;
  reader_05.reader._39_1_ = local_a38.reader._39_1_;
  reader_05.reader.nestingLimit = local_a38.reader.nestingLimit;
  reader_05.reader._44_4_ = local_a38.reader._44_4_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_05,expected_20);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            (&local_a98,(Reader *)&_kjCondition_14.result);
  local_aac[0] = '\f';
  local_aac[1] = 0x22;
  local_aac[2] = 0;
  local_aac[3] = 0xff;
  local_aa8 = local_aac;
  local_aa0 = 4;
  expected_19._M_len = 4;
  expected_19._M_array = local_aa8;
  reader_06.reader.capTable = local_a98.reader.capTable;
  reader_06.reader.segment = local_a98.reader.segment;
  reader_06.reader.ptr = local_a98.reader.ptr;
  reader_06.reader.elementCount = local_a98.reader.elementCount;
  reader_06.reader.step = local_a98.reader.step;
  reader_06.reader.structDataSize = local_a98.reader.structDataSize;
  reader_06.reader.structPointerCount = local_a98.reader.structPointerCount;
  reader_06.reader.elementSize = local_a98.reader.elementSize;
  reader_06.reader._39_1_ = local_a98.reader._39_1_;
  reader_06.reader.nestingLimit = local_a98.reader.nestingLimit;
  reader_06.reader._44_4_ = local_a98.reader._44_4_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_06,expected_19);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            (&local_ae0,(Reader *)&_kjCondition_14.result);
  local_af8[0] = 0x4d2;
  local_af8[1] = 0x162e;
  local_af8[2] = 0;
  local_af8[3] = 0xffff;
  local_af0 = local_af8;
  local_ae8 = 4;
  expected_18._M_len = 4;
  expected_18._M_array = local_af0;
  reader_07.reader.capTable = local_ae0.reader.capTable;
  reader_07.reader.segment = local_ae0.reader.segment;
  reader_07.reader.ptr = local_ae0.reader.ptr;
  reader_07.reader.elementCount = local_ae0.reader.elementCount;
  reader_07.reader.step = local_ae0.reader.step;
  reader_07.reader.structDataSize = local_ae0.reader.structDataSize;
  reader_07.reader.structPointerCount = local_ae0.reader.structPointerCount;
  reader_07.reader.elementSize = local_ae0.reader.elementSize;
  reader_07.reader._39_1_ = local_ae0.reader._39_1_;
  reader_07.reader.nestingLimit = local_ae0.reader.nestingLimit;
  reader_07.reader._44_4_ = local_ae0.reader._44_4_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_07,expected_18);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            (&local_b28,(Reader *)&_kjCondition_14.result);
  local_b48[0] = 0xbc614e;
  local_b48[1] = 0x55f2cc0;
  local_b48[2] = 0;
  local_b48[3] = 0xffffffff;
  local_b38 = local_b48;
  local_b30 = 4;
  expected_17._M_len = 4;
  expected_17._M_array = local_b38;
  reader_08.reader.capTable = local_b28.reader.capTable;
  reader_08.reader.segment = local_b28.reader.segment;
  reader_08.reader.ptr = local_b28.reader.ptr;
  reader_08.reader.elementCount = local_b28.reader.elementCount;
  reader_08.reader.step = local_b28.reader.step;
  reader_08.reader.structDataSize = local_b28.reader.structDataSize;
  reader_08.reader.structPointerCount = local_b28.reader.structPointerCount;
  reader_08.reader.elementSize = local_b28.reader.elementSize;
  reader_08.reader._39_1_ = local_b28.reader._39_1_;
  reader_08.reader.nestingLimit = local_b28.reader.nestingLimit;
  reader_08.reader._44_4_ = local_b28.reader._44_4_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_08,expected_17);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            (&local_b78,(Reader *)&_kjCondition_14.result);
  local_ba8[0] = 0x7048860ddf79;
  local_ba8[1] = 0x2697502ec8ad2;
  local_ba8[2] = 0;
  local_ba8[3] = 0xffffffffffffffff;
  local_b88 = local_ba8;
  local_b80 = 4;
  expected_16._M_len = 4;
  expected_16._M_array = local_b88;
  reader_09.reader.capTable = local_b78.reader.capTable;
  reader_09.reader.segment = local_b78.reader.segment;
  reader_09.reader.ptr = local_b78.reader.ptr;
  reader_09.reader.elementCount = local_b78.reader.elementCount;
  reader_09.reader.step = local_b78.reader.step;
  reader_09.reader.structDataSize = local_b78.reader.structDataSize;
  reader_09.reader.structPointerCount = local_b78.reader.structPointerCount;
  reader_09.reader.elementSize = local_b78.reader.elementSize;
  reader_09.reader._39_1_ = local_b78.reader._39_1_;
  reader_09.reader.nestingLimit = local_b78.reader.nestingLimit;
  reader_09.reader._44_4_ = local_b78.reader._44_4_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_09,expected_16);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            (&local_bd8,(Reader *)&_kjCondition_14.result);
  local_c00[0] = 0.0;
  local_c00[1] = 1234567.0;
  local_c00[2] = 1e+37;
  local_c00[3] = -1e+37;
  local_c00[4] = 1e-37;
  local_c00[5] = -1e-37;
  local_be8 = local_c00;
  local_be0 = 6;
  expected_15._M_len = 6;
  expected_15._M_array = local_be8;
  reader_10.reader.capTable = local_bd8.reader.capTable;
  reader_10.reader.segment = local_bd8.reader.segment;
  reader_10.reader.ptr = local_bd8.reader.ptr;
  reader_10.reader.elementCount = local_bd8.reader.elementCount;
  reader_10.reader.step = local_bd8.reader.step;
  reader_10.reader.structDataSize = local_bd8.reader.structDataSize;
  reader_10.reader.structPointerCount = local_bd8.reader.structPointerCount;
  reader_10.reader.elementSize = local_bd8.reader.elementSize;
  reader_10.reader._39_1_ = local_bd8.reader._39_1_;
  reader_10.reader.nestingLimit = local_bd8.reader.nestingLimit;
  reader_10.reader._44_4_ = local_bd8.reader._44_4_;
  checkList<capnp::List<float,_(capnp::Kind)0>::Reader,_capnp::List<float,_(capnp::Kind)0>_>
            (reader_10,expected_15);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            (&local_c30,(Reader *)&_kjCondition_14.result);
  memcpy(local_c70,&DAT_009f7bd8,0x30);
  local_c40 = local_c70;
  local_c38 = 6;
  expected_14._M_len = 6;
  expected_14._M_array = local_c40;
  reader_11.reader.capTable = local_c30.reader.capTable;
  reader_11.reader.segment = local_c30.reader.segment;
  reader_11.reader.ptr = local_c30.reader.ptr;
  reader_11.reader.elementCount = local_c30.reader.elementCount;
  reader_11.reader.step = local_c30.reader.step;
  reader_11.reader.structDataSize = local_c30.reader.structDataSize;
  reader_11.reader.structPointerCount = local_c30.reader.structPointerCount;
  reader_11.reader.elementSize = local_c30.reader.elementSize;
  reader_11.reader._39_1_ = local_c30.reader._39_1_;
  reader_11.reader.nestingLimit = local_c30.reader.nestingLimit;
  reader_11.reader._44_4_ = local_c30.reader._44_4_;
  checkList<capnp::List<double,_(capnp::Kind)0>::Reader,_capnp::List<double,_(capnp::Kind)0>_>
            (reader_11,expected_14);
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            (&local_ca0,(Reader *)&_kjCondition_14.result);
  Text::Reader::Reader(&local_ce0,"quux");
  Text::Reader::Reader(&RStack_cd0,"corge");
  Text::Reader::Reader(&RStack_cc0,"grault");
  local_cb0 = &local_ce0;
  local_ca8 = 3;
  expected_13._M_len = 3;
  expected_13._M_array = local_cb0;
  reader_12.reader.capTable = local_ca0.reader.capTable;
  reader_12.reader.segment = local_ca0.reader.segment;
  reader_12.reader.ptr = local_ca0.reader.ptr;
  reader_12.reader.elementCount = local_ca0.reader.elementCount;
  reader_12.reader.step = local_ca0.reader.step;
  reader_12.reader.structDataSize = local_ca0.reader.structDataSize;
  reader_12.reader.structPointerCount = local_ca0.reader.structPointerCount;
  reader_12.reader.elementSize = local_ca0.reader.elementSize;
  reader_12.reader._39_1_ = local_ca0.reader._39_1_;
  reader_12.reader.nestingLimit = local_ca0.reader.nestingLimit;
  reader_12.reader._44_4_ = local_ca0.reader._44_4_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_12,expected_13);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            (&local_d10,(Reader *)&_kjCondition_14.result);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("garply");
  _::data("waldo");
  _::data("fred");
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)&listReader.reader.nestingLimit;
  reader_13.reader.capTable = local_d10.reader.capTable;
  reader_13.reader.segment = local_d10.reader.segment;
  reader_13.reader.ptr = local_d10.reader.ptr;
  reader_13.reader.elementCount = local_d10.reader.elementCount;
  reader_13.reader.step = local_d10.reader.step;
  reader_13.reader.structDataSize = local_d10.reader.structDataSize;
  reader_13.reader.structPointerCount = local_d10.reader.structPointerCount;
  reader_13.reader.elementSize = local_d10.reader.elementSize;
  reader_13.reader._39_1_ = local_d10.reader._39_1_;
  reader_13.reader.nestingLimit = local_d10.reader.nestingLimit;
  reader_13.reader._44_4_ = local_d10.reader._44_4_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
            (reader_13,expected_12);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)&_kjCondition_31.result,(Reader *)&_kjCondition_14.result);
  local_da8 = 3;
  local_da4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_da8);
  f.exception._4_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                 ((Reader *)&_kjCondition_31.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_da0,&local_da4,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_da0);
  if (!bVar1) {
    local_dbc = 3;
    local_dc0 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                          ((Reader *)&_kjCondition_31.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_db8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x111,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_da0,&local_dbc,&local_dc0);
    kj::_::Debug::Fault::fatal(&local_db8);
  }
  local_e08 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 1");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_e48,(Reader *)&_kjCondition_31.result,0);
  local_e18 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_e48);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_e00,
             (DebugExpression<char_const(&)[15]> *)&local_e08,(Reader *)&local_e18);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e00);
  if (!bVar1) {
    local_e49 = kj::_::Debug::shouldLog(ERROR);
    while (local_e49 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&_kjCondition_33.result,(Reader *)&_kjCondition_31.result,0);
      local_e60 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&_kjCondition_33.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"x structlist 1\", listReader[0].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_e00,
                 (char (*) [15])"x structlist 1",(Reader *)&local_e60);
      local_e49 = false;
    }
  }
  local_ec8 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 2");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_f08,(Reader *)&_kjCondition_31.result,1);
  local_ed8 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_f08);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_ec0,
             (DebugExpression<char_const(&)[15]> *)&local_ec8,(Reader *)&local_ed8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ec0);
  if (!bVar1) {
    local_f09 = kj::_::Debug::shouldLog(ERROR);
    while (local_f09 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&_kjCondition_34.result,(Reader *)&_kjCondition_31.result,1);
      local_f20 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)&_kjCondition_34.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"x structlist 2\", listReader[1].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_ec0,
                 (char (*) [15])"x structlist 2",(Reader *)&local_f20);
      local_f09 = false;
    }
  }
  local_f88 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 3");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_fc8,(Reader *)&_kjCondition_31.result,2);
  local_f98 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_fc8);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_f80,
             (DebugExpression<char_const(&)[15]> *)&local_f88,(Reader *)&local_f98);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f80);
  if (!bVar1) {
    local_fc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fc9 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_1010,(Reader *)&_kjCondition_31.result,2);
      local_fe0 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_1010);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"x structlist 3\", listReader[2].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_f80,
                 (char (*) [15])"x structlist 3",(Reader *)&local_fe0);
      local_fc9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getEnumList
            (&local_1040,(Reader *)&_kjCondition_14.result);
  _kjCondition_35._26_2_ = 3;
  _kjCondition_35._28_2_ = 1;
  _kjCondition_35._30_2_ = 6;
  expected_11._M_len = 3;
  expected_11._M_array = (iterator)&_kjCondition_35.field_0x1a;
  reader_14.reader.capTable = local_1040.reader.capTable;
  reader_14.reader.segment = local_1040.reader.segment;
  reader_14.reader.ptr = local_1040.reader.ptr;
  reader_14.reader.elementCount = local_1040.reader.elementCount;
  reader_14.reader.step = local_1040.reader.step;
  reader_14.reader.structDataSize = local_1040.reader.structDataSize;
  reader_14.reader.structPointerCount = local_1040.reader.structPointerCount;
  reader_14.reader.elementSize = local_1040.reader.elementSize;
  reader_14.reader._39_1_ = local_1040.reader._39_1_;
  reader_14.reader.nestingLimit = local_1040.reader.nestingLimit;
  reader_14.reader._44_4_ = local_1040.reader._44_4_;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
            (reader_14,expected_11);
  local_107c = CORGE;
  local_107a = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_107c);
  local_107e = capnproto_test::capnp::test::TestAllTypes::Reader::getEnumField
                         ((Reader *)&stack0x00000008);
  kj::_::DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3>::operator==
            ((DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              *)&local_1078,&local_107a,&local_107e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_1078);
  if (!bVar1) {
    local_107f = kj::_::Debug::shouldLog(ERROR);
    while (local_107f != false) {
      _kjCondition_36._30_2_ = 5;
      _kjCondition_36._28_2_ =
           capnproto_test::capnp::test::TestAllTypes::Reader::getEnumField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x118,ERROR,
                 "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", _kjCondition, TestEnum::CORGE, reader.getEnumField()"
                 ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&local_1078,(TestEnum_9c8e9318b29d9cd3 *)&_kjCondition_36.field_0x1e,
                 (TestEnum_9c8e9318b29d9cd3 *)&_kjCondition_36.field_0x1c);
      local_107f = false;
    }
  }
  local_10b0 = 6;
  local_10ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_10b0);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            ((Reader *)local_10e8,(Reader *)&stack0x00000008);
  local_10b4 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)local_10e8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_10a8,&local_10ac,&local_10b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_10a8);
  if (!bVar1) {
    local_10e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_10e9 != false) {
      local_10f0 = 6;
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
                (&local_1128,(Reader *)&stack0x00000008);
      local_10f4 = List<capnp::Void,_(capnp::Kind)0>::Reader::size(&local_1128);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x11a,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", _kjCondition, 6u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_10a8,&local_10f0,&local_10f4);
      local_10e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            (&local_1158,(Reader *)&stack0x00000008);
  local_116c[0] = true;
  local_116c[1] = false;
  local_116c[2] = false;
  local_116c[3] = true;
  local_1168 = local_116c;
  local_1160 = 4;
  expected_10._M_len = 4;
  expected_10._M_array = local_1168;
  reader_15.reader.capTable = local_1158.reader.capTable;
  reader_15.reader.segment = local_1158.reader.segment;
  reader_15.reader.ptr = local_1158.reader.ptr;
  reader_15.reader.elementCount = local_1158.reader.elementCount;
  reader_15.reader.step = local_1158.reader.step;
  reader_15.reader.structDataSize = local_1158.reader.structDataSize;
  reader_15.reader.structPointerCount = local_1158.reader.structPointerCount;
  reader_15.reader.elementSize = local_1158.reader.elementSize;
  reader_15.reader._39_1_ = local_1158.reader._39_1_;
  reader_15.reader.nestingLimit = local_1158.reader.nestingLimit;
  reader_15.reader._44_4_ = local_1158.reader._44_4_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_15,expected_10);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            (&local_11a0,(Reader *)&stack0x00000008);
  local_11b2[0] = 'o';
  local_11b2[1] = 0x91;
  local_11b0 = local_11b2;
  local_11a8 = 2;
  expected_09._M_len = 2;
  expected_09._M_array = local_11b0;
  reader_16.reader.capTable = local_11a0.reader.capTable;
  reader_16.reader.segment = local_11a0.reader.segment;
  reader_16.reader.ptr = local_11a0.reader.ptr;
  reader_16.reader.elementCount = local_11a0.reader.elementCount;
  reader_16.reader.step = local_11a0.reader.step;
  reader_16.reader.structDataSize = local_11a0.reader.structDataSize;
  reader_16.reader.structPointerCount = local_11a0.reader.structPointerCount;
  reader_16.reader.elementSize = local_11a0.reader.elementSize;
  reader_16.reader._39_1_ = local_11a0.reader._39_1_;
  reader_16.reader.nestingLimit = local_11a0.reader.nestingLimit;
  reader_16.reader._44_4_ = local_11a0.reader._44_4_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_16,expected_09);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            (&local_11e8,(Reader *)&stack0x00000008);
  local_11fc[0] = 0x2b67;
  local_11fc[1] = 0xd499;
  local_11f8 = local_11fc;
  local_11f0 = 2;
  expected_08._M_len = 2;
  expected_08._M_array = local_11f8;
  reader_17.reader.capTable = local_11e8.reader.capTable;
  reader_17.reader.segment = local_11e8.reader.segment;
  reader_17.reader.ptr = local_11e8.reader.ptr;
  reader_17.reader.elementCount = local_11e8.reader.elementCount;
  reader_17.reader.step = local_11e8.reader.step;
  reader_17.reader.structDataSize = local_11e8.reader.structDataSize;
  reader_17.reader.structPointerCount = local_11e8.reader.structPointerCount;
  reader_17.reader.elementSize = local_11e8.reader.elementSize;
  reader_17.reader._39_1_ = local_11e8.reader._39_1_;
  reader_17.reader.nestingLimit = local_11e8.reader.nestingLimit;
  reader_17.reader._44_4_ = local_11e8.reader._44_4_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_17,expected_08);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            (&local_1230,(Reader *)&stack0x00000008);
  local_1248[0] = 0x69f6bc7;
  local_1248[1] = 0xf9609439;
  local_1240 = local_1248;
  local_1238 = 2;
  expected_07._M_len = 2;
  expected_07._M_array = local_1240;
  reader_18.reader.capTable = local_1230.reader.capTable;
  reader_18.reader.segment = local_1230.reader.segment;
  reader_18.reader.ptr = local_1230.reader.ptr;
  reader_18.reader.elementCount = local_1230.reader.elementCount;
  reader_18.reader.step = local_1230.reader.step;
  reader_18.reader.structDataSize = local_1230.reader.structDataSize;
  reader_18.reader.structPointerCount = local_1230.reader.structPointerCount;
  reader_18.reader.elementSize = local_1230.reader.elementSize;
  reader_18.reader._39_1_ = local_1230.reader._39_1_;
  reader_18.reader.nestingLimit = local_1230.reader.nestingLimit;
  reader_18.reader._44_4_ = local_1230.reader._44_4_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_18,expected_07);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            (&local_1278,(Reader *)&stack0x00000008);
  local_1298[0] = 0xf6b75ab2bc471c7;
  local_1298[1] = 0xf0948a54d43b8e39;
  local_1288 = local_1298;
  local_1280 = 2;
  expected_06._M_len = 2;
  expected_06._M_array = local_1288;
  reader_19.reader.capTable = local_1278.reader.capTable;
  reader_19.reader.segment = local_1278.reader.segment;
  reader_19.reader.ptr = local_1278.reader.ptr;
  reader_19.reader.elementCount = local_1278.reader.elementCount;
  reader_19.reader.step = local_1278.reader.step;
  reader_19.reader.structDataSize = local_1278.reader.structDataSize;
  reader_19.reader.structPointerCount = local_1278.reader.structPointerCount;
  reader_19.reader.elementSize = local_1278.reader.elementSize;
  reader_19.reader._39_1_ = local_1278.reader._39_1_;
  reader_19.reader.nestingLimit = local_1278.reader.nestingLimit;
  reader_19.reader._44_4_ = local_1278.reader._44_4_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_19,expected_06);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            (&local_12c8,(Reader *)&stack0x00000008);
  local_12da[0] = 'o';
  local_12da[1] = 0xde;
  local_12d8 = local_12da;
  local_12d0 = 2;
  expected_05._M_len = 2;
  expected_05._M_array = local_12d8;
  reader_20.reader.capTable = local_12c8.reader.capTable;
  reader_20.reader.segment = local_12c8.reader.segment;
  reader_20.reader.ptr = local_12c8.reader.ptr;
  reader_20.reader.elementCount = local_12c8.reader.elementCount;
  reader_20.reader.step = local_12c8.reader.step;
  reader_20.reader.structDataSize = local_12c8.reader.structDataSize;
  reader_20.reader.structPointerCount = local_12c8.reader.structPointerCount;
  reader_20.reader.elementSize = local_12c8.reader.elementSize;
  reader_20.reader._39_1_ = local_12c8.reader._39_1_;
  reader_20.reader.nestingLimit = local_12c8.reader.nestingLimit;
  reader_20.reader._44_4_ = local_12c8.reader._44_4_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_20,expected_05);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            (&local_1310,(Reader *)&stack0x00000008);
  local_1324[0] = 0x8235;
  local_1324[1] = 0xad9c;
  local_1320 = local_1324;
  local_1318 = 2;
  expected_04._M_len = 2;
  expected_04._M_array = local_1320;
  reader_21.reader.capTable = local_1310.reader.capTable;
  reader_21.reader.segment = local_1310.reader.segment;
  reader_21.reader.ptr = local_1310.reader.ptr;
  reader_21.reader.elementCount = local_1310.reader.elementCount;
  reader_21.reader.step = local_1310.reader.step;
  reader_21.reader.structDataSize = local_1310.reader.structDataSize;
  reader_21.reader.structPointerCount = local_1310.reader.structPointerCount;
  reader_21.reader.elementSize = local_1310.reader.elementSize;
  reader_21.reader._39_1_ = local_1310.reader._39_1_;
  reader_21.reader.nestingLimit = local_1310.reader.nestingLimit;
  reader_21.reader._44_4_ = local_1310.reader._44_4_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_21,expected_04);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            (&local_1358,(Reader *)&stack0x00000008);
  local_136c = 0xc6aea155;
  local_1368 = &local_136c;
  local_1360 = 1;
  expected_03._M_len = 1;
  expected_03._M_array = local_1368;
  reader_22.reader.capTable = local_1358.reader.capTable;
  reader_22.reader.segment = local_1358.reader.segment;
  reader_22.reader.ptr = local_1358.reader.ptr;
  reader_22.reader.elementCount = local_1358.reader.elementCount;
  reader_22.reader.step = local_1358.reader.step;
  reader_22.reader.structDataSize = local_1358.reader.structDataSize;
  reader_22.reader.structPointerCount = local_1358.reader.structPointerCount;
  reader_22.reader.elementSize = local_1358.reader.elementSize;
  reader_22.reader._39_1_ = local_1358.reader._39_1_;
  reader_22.reader.nestingLimit = local_1358.reader.nestingLimit;
  reader_22.reader._44_4_ = local_1358.reader._44_4_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_22,expected_03);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            (&local_13a0,(Reader *)&stack0x00000008);
  listReader_1.reader.nestingLimit = -0x4a538e39;
  listReader_1.reader._44_4_ = 0x9a3298af;
  expected_02._M_len = 1;
  expected_02._M_array = (iterator)&listReader_1.reader.nestingLimit;
  reader_23.reader.capTable = local_13a0.reader.capTable;
  reader_23.reader.segment = local_13a0.reader.segment;
  reader_23.reader.ptr = local_13a0.reader.ptr;
  reader_23.reader.elementCount = local_13a0.reader.elementCount;
  reader_23.reader.step = local_13a0.reader.step;
  reader_23.reader.structDataSize = local_13a0.reader.structDataSize;
  reader_23.reader.structPointerCount = local_13a0.reader.structPointerCount;
  reader_23.reader.elementSize = local_13a0.reader.elementSize;
  reader_23.reader._39_1_ = local_13a0.reader._39_1_;
  reader_23.reader.nestingLimit = local_13a0.reader.nestingLimit;
  reader_23.reader._44_4_ = local_13a0.reader._44_4_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_23,expected_02);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            ((Reader *)&_kjCondition_37.result,(Reader *)&stack0x00000008);
  local_1410 = 4;
  local_140c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1410);
  f_1.exception._4_4_ = List<float,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_37.result)
  ;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1408,&local_140c,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1408);
  if (!bVar1) {
    _kjCondition_38._28_4_ = 4;
    _kjCondition_38._24_4_ =
         List<float,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_37.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_1420,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x126,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_1408,
               (uint *)&_kjCondition_38.field_0x1c,(uint *)&_kjCondition_38.result);
    kj::_::Debug::Fault::fatal(&local_1420);
  }
  fStack_1450 = 5555.5;
  local_144c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffebb0);
  local_1454 = List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,0);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_1448,&local_144c,&local_1454);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1448);
  if (!bVar1) {
    local_1455 = kj::_::Debug::shouldLog(ERROR);
    while (local_1455 != false) {
      _kjCondition_39._28_4_ = 0x45ad9c00;
      _kjCondition_39._24_4_ =
           List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,0);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x127,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0])\", _kjCondition, 5555.5f, listReader[0]"
                 ,(char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
                 (DebugComparison<float,_float> *)local_1448,(float *)&_kjCondition_39.field_0x1c,
                 (float *)&_kjCondition_39.result);
      local_1455 = false;
    }
  }
  fStack_1488 = kj::inf();
  local_1484 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffeb78);
  local_148c = List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,1);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_1480,&local_1484,&local_148c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1480);
  if (!bVar1) {
    local_148d = kj::_::Debug::shouldLog(ERROR);
    while (local_148d != false) {
      _kjCondition_40._28_4_ = kj::inf();
      _kjCondition_40._24_4_ =
           List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,1);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x128,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 (DebugComparison<float,_float> *)local_1480,(float *)&_kjCondition_40.field_0x1c,
                 (float *)&_kjCondition_40.result);
      local_148d = false;
    }
  }
  fStack_14c0 = kj::inf();
  fStack_14c0 = -fStack_14c0;
  local_14bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffeb40);
  local_14c4 = List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,2);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_14b8,&local_14bc,&local_14c4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14b8);
  if (!bVar1) {
    local_14c5 = kj::_::Debug::shouldLog(ERROR);
    while (local_14c5 != false) {
      fStack_14cc = kj::inf();
      fStack_14cc = -fStack_14cc;
      local_14d0 = List<float,_(capnp::Kind)0>::Reader::operator[]
                             ((Reader *)&_kjCondition_37.result,2);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x129,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 (DebugComparison<float,_float> *)local_14b8,&stack0xffffffffffffeb34,&local_14d0);
      local_14c5 = false;
    }
  }
  fVar2 = List<float,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_37.result,3);
  listReader_2.reader._46_1_ = isNaN(fVar2);
  listReader_2.reader._47_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)&listReader_2.reader.field_0x2e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&listReader_2.reader.field_0x2f);
  if (!bVar1) {
    listReader_2.reader._45_1_ = kj::_::Debug::shouldLog(ERROR);
    while (listReader_2.reader._45_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12a,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                 (char (*) [38])"failed: expected isNaN(listReader[3])",
                 (DebugExpression<bool> *)&listReader_2.reader.field_0x2f);
      listReader_2.reader._45_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            ((Reader *)&_kjCondition_42.result,(Reader *)&stack0x00000008);
  local_1530 = 4;
  local_152c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1530);
  f_2.exception._4_4_ =
       List<double,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_42.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1528,&local_152c,
             (uint *)((long)&f_2.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1528);
  if (!bVar1) {
    _kjCondition_43._36_4_ = 4;
    _kjCondition_43._32_4_ =
         List<double,_(capnp::Kind)0>::Reader::size((Reader *)&_kjCondition_42.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_1540,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12e,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_1528,
               (uint *)&_kjCondition_43.field_0x24,(uint *)&_kjCondition_43.result);
    kj::_::Debug::Fault::fatal(&local_1540);
  }
  local_1580 = 7777.75;
  local_1578 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1580);
  dStack_1588 = List<double,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition_42.result,0);
  kj::_::DebugExpression<double>::operator==
            ((DebugComparison<double,_double> *)local_1570,&local_1578,&stack0xffffffffffffea78);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1570);
  if (!bVar1) {
    local_1589 = kj::_::Debug::shouldLog(ERROR);
    while (local_1589 != false) {
      local_1598 = 7777.75;
      _kjCondition_44._32_8_ =
           List<double,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_42.result,0);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<double,double>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12f,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0])\", _kjCondition, 7777.75, listReader[0]"
                 ,(char (*) [46])"failed: expected (7777.75) == (listReader[0])",
                 (DebugComparison<double,_double> *)local_1570,&local_1598,
                 (double *)&_kjCondition_44.result);
      local_1589 = false;
    }
  }
  local_15d0 = kj::inf();
  local_15cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_15d0);
  dStack_15d8 = List<double,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition_42.result,1);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_15c8,&local_15cc,&stack0xffffffffffffea28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_15c8);
  if (!bVar1) {
    local_15d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_15d9 != false) {
      local_15e0 = kj::inf();
      _kjCondition_45._32_8_ =
           List<double,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_42.result,1);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x130,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 (DebugComparison<float,_double> *)local_15c8,&local_15e0,
                 (double *)&_kjCondition_45.result);
      local_15d9 = false;
    }
  }
  local_1618 = kj::inf();
  local_1618 = -local_1618;
  local_1614 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1618);
  dStack_1620 = List<double,_(capnp::Kind)0>::Reader::operator[]
                          ((Reader *)&_kjCondition_42.result,2);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_1610,&local_1614,&stack0xffffffffffffe9e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1610);
  if (!bVar1) {
    local_1621 = kj::_::Debug::shouldLog(ERROR);
    while (local_1621 != false) {
      local_1628 = kj::inf();
      local_1628 = -local_1628;
      dStack_1630 = List<double,_(capnp::Kind)0>::Reader::operator[]
                              ((Reader *)&_kjCondition_42.result,2);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x131,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 (DebugComparison<float,_double> *)local_1610,&local_1628,&stack0xffffffffffffe9d0);
      local_1621 = false;
    }
  }
  dVar3 = List<double,_(capnp::Kind)0>::Reader::operator[]((Reader *)&_kjCondition_42.result,3);
  local_1632 = isNaN(dVar3);
  local_1631 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1632);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1631);
  if (!bVar1) {
    local_1633 = kj::_::Debug::shouldLog(ERROR);
    while (local_1633 != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x132,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                 (char (*) [38])"failed: expected isNaN(listReader[3])",&local_1631);
      local_1633 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            (&local_1668,(Reader *)&stack0x00000008);
  Text::Reader::Reader(&local_16a8,"plugh");
  Text::Reader::Reader(&RStack_1698,"xyzzy");
  Text::Reader::Reader(&RStack_1688,"thud");
  local_1678 = &local_16a8;
  local_1670 = 3;
  expected_01._M_len = 3;
  expected_01._M_array = local_1678;
  reader_24.reader.capTable = local_1668.reader.capTable;
  reader_24.reader.segment = local_1668.reader.segment;
  reader_24.reader.ptr = local_1668.reader.ptr;
  reader_24.reader.elementCount = local_1668.reader.elementCount;
  reader_24.reader.step = local_1668.reader.step;
  reader_24.reader.structDataSize = local_1668.reader.structDataSize;
  reader_24.reader.structPointerCount = local_1668.reader.structPointerCount;
  reader_24.reader.elementSize = local_1668.reader.elementSize;
  reader_24.reader._39_1_ = local_1668.reader._39_1_;
  reader_24.reader.nestingLimit = local_1668.reader.nestingLimit;
  reader_24.reader._44_4_ = local_1668.reader._44_4_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_24,expected_01);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            (&local_16d8,(Reader *)&stack0x00000008);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("oops");
  _::data("exhausted");
  _::data("rfc3092");
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&listReader_3.reader.nestingLimit;
  reader_25.reader.capTable = local_16d8.reader.capTable;
  reader_25.reader.segment = local_16d8.reader.segment;
  reader_25.reader.ptr = local_16d8.reader.ptr;
  reader_25.reader.elementCount = local_16d8.reader.elementCount;
  reader_25.reader.step = local_16d8.reader.step;
  reader_25.reader.structDataSize = local_16d8.reader.structDataSize;
  reader_25.reader.structPointerCount = local_16d8.reader.structPointerCount;
  reader_25.reader.elementSize = local_16d8.reader.elementSize;
  reader_25.reader._39_1_ = local_16d8.reader._39_1_;
  reader_25.reader.nestingLimit = local_16d8.reader.nestingLimit;
  reader_25.reader._44_4_ = local_16d8.reader._44_4_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
            (reader_25,expected_00);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)&_kjCondition_47.result,(Reader *)&stack0x00000008);
  local_1770 = 3;
  local_176c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1770);
  f_3.exception._4_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                 ((Reader *)&_kjCondition_47.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1768,&local_176c,
             (uint *)((long)&f_3.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1768);
  if (bVar1) {
    local_17c0 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89d8);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_1800,(Reader *)&_kjCondition_47.result,0);
    local_17d0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)local_1800);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_17b8,
               (DebugExpression<char_const(&)[13]> *)&local_17c0,(Reader *)&local_17d0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17b8);
    if (!bVar1) {
      local_1801 = kj::_::Debug::shouldLog(ERROR);
      while (local_1801 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_49.result,(Reader *)&_kjCondition_47.result,0);
        local_1818 = (ArrayPtr<const_char>)
                     capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                               ((Reader *)&_kjCondition_49.result);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x139,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"structlist 1\", listReader[0].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_17b8,
                   (char (*) [13])0x9f89d8,(Reader *)&local_1818);
        local_1801 = false;
      }
    }
    local_1880 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89e7);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_18c0,(Reader *)&_kjCondition_47.result,1);
    local_1890 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)local_18c0);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_1878,
               (DebugExpression<char_const(&)[13]> *)&local_1880,(Reader *)&local_1890);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1878);
    if (!bVar1) {
      local_18c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_18c1 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_50.result,(Reader *)&_kjCondition_47.result,1);
        local_18d8 = (ArrayPtr<const_char>)
                     capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                               ((Reader *)&_kjCondition_50.result);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13a,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"structlist 2\", listReader[1].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_1878,
                   (char (*) [13])0x9f89e7,(Reader *)&local_18d8);
        local_18c1 = false;
      }
    }
    local_1940 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x9f89f6);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_1980,(Reader *)&_kjCondition_47.result,2);
    local_1950 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)local_1980);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_1938,
               (DebugExpression<char_const(&)[13]> *)&local_1940,(Reader *)&local_1950);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1938);
    if (!bVar1) {
      local_1981 = kj::_::Debug::shouldLog(ERROR);
      while (local_1981 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                  (&local_19c8,(Reader *)&_kjCondition_47.result,2);
        local_1998 = (ArrayPtr<const_char>)
                     capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_19c8);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13b,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"structlist 3\", listReader[2].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_1938,
                   (char (*) [13])0x9f89f6,(Reader *)&local_1998);
        local_1981 = false;
      }
    }
    capnproto_test::capnp::test::TestAllTypes::Reader::getEnumList
              (&local_19f8,(Reader *)&stack0x00000008);
    local_1a0c[0] = FOO;
    local_1a0c[1] = 7;
    local_1a08 = local_1a0c;
    local_1a00 = 2;
    expected._M_len = 2;
    expected._M_array = local_1a08;
    reader_26.reader.capTable = local_19f8.reader.capTable;
    reader_26.reader.segment = local_19f8.reader.segment;
    reader_26.reader.ptr = local_19f8.reader.ptr;
    reader_26.reader.elementCount = local_19f8.reader.elementCount;
    reader_26.reader.step = local_19f8.reader.step;
    reader_26.reader.structDataSize = local_19f8.reader.structDataSize;
    reader_26.reader.structPointerCount = local_19f8.reader.structPointerCount;
    reader_26.reader.elementSize = local_19f8.reader.elementSize;
    reader_26.reader._39_1_ = local_19f8.reader._39_1_;
    reader_26.reader.nestingLimit = local_19f8.reader.nestingLimit;
    reader_26.reader._44_4_ = local_19f8.reader._44_4_;
    checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
              (reader_26,expected);
    return;
  }
  _kjCondition_48._44_4_ = 3;
  _kjCondition_48._40_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                 ((Reader *)&_kjCondition_47.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_1780,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x138,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_1768,
             (uint *)&_kjCondition_48.field_0x2c,(uint *)&_kjCondition_48.result);
  kj::_::Debug::Fault::fatal(&local_1780);
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}